

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O2

void __thiscall MapWriter_read_Test::~MapWriter_read_Test(MapWriter_read_Test *this)

{
  anon_unknown.dwarf_28a10::MapWriter::~MapWriter(&this->super_MapWriter);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (MapWriter, read) {
    auto archive = pstore::serialize::archive::make_reader (std::begin (writer_));
    MapWriter::map_type const actual = pstore::serialize::read<MapWriter::map_type> (archive);
    EXPECT_EQ (map_, actual);
    EXPECT_EQ (std::end (writer_), archive.iterator ());
}